

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTest.cpp
# Opt level: O0

bool __thiscall FileTest::fillFile(FileTest *this,File *f)

{
  int iVar1;
  int local_130;
  int res;
  int i_1;
  int i;
  uint8_t buffer [256];
  File *f_local;
  FileTest *this_local;
  
  for (res = 0; res < 0x100; res = res + 1) {
    *(char *)((long)&i_1 + (long)res) = (char)res;
  }
  local_130 = 0;
  while( true ) {
    if (5 < local_130) {
      return true;
    }
    i_1._0_1_ = (undefined1)local_130;
    iVar1 = (**(code **)(*(long *)f + 0x18))(f,&i_1,0x100);
    if (iVar1 != 0x100) break;
    local_130 = local_130 + 1;
  }
  return false;
}

Assistant:

bool FileTest::fillFile( File &f )
{
	uint8_t buffer[ 256 ];
	
	for ( int i = 0; i < 256; i++ )
		buffer[ i ] = i;
	
	for ( int i = 0; i < 6; i++ )
	{
		buffer[ 0 ] = i;

		int res = f.write( buffer, 256 );
		
		if ( res != 256 )
			return false;
	}
	return true;
}